

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

FxExpression * __thiscall FxMinusSign::Resolve(FxMinusSign *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  FxConstant *local_88;
  FxExpression *e;
  ExpVal val;
  FCompileContext *ctx_local;
  FxMinusSign *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    val.field_1 = (anon_union_8_3_addc324a_for_ExpVal_1)ctx;
    if (this->Operand != (FxExpression *)0x0) {
      iVar2 = (*this->Operand->_vptr_FxExpression[2])(this->Operand,ctx);
      this->Operand = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    if (this->Operand == (FxExpression *)0x0) {
      if (this != (FxMinusSign *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxMinusSign *)0x0;
    }
    else {
      bVar1 = FxExpression::IsNumeric(this->Operand);
      if (bVar1) {
        uVar3 = (*this->Operand->_vptr_FxExpression[3])();
        if ((uVar3 & 1) == 0) {
          (this->super_FxExpression).ValueType = this->Operand->ValueType;
        }
        else {
          FxConstant::GetValue((FxConstant *)&e);
          iVar2 = (*e->_vptr_FxExpression[0x12])();
          if (iVar2 == 0) {
            local_88 = (FxConstant *)operator_new(0x48);
            FxConstant::FxConstant
                      (local_88,-(int)val.Type,&(this->super_FxExpression).ScriptPosition);
          }
          else {
            local_88 = (FxConstant *)operator_new(0x48);
            FxConstant::FxConstant
                      (local_88,-(double)CONCAT44(val.Type._4_4_,(int)val.Type),
                       &(this->super_FxExpression).ScriptPosition);
          }
          if (this != (FxMinusSign *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxMinusSign *)local_88;
          ExpVal::~ExpVal((ExpVal *)&e);
        }
      }
      else {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
        if (this != (FxMinusSign *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxMinusSign *)0x0;
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxMinusSign::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->IsNumeric())
	{
		if (Operand->isConstant())
		{
			ExpVal val = static_cast<FxConstant *>(Operand)->GetValue();
			FxExpression *e = val.Type->GetRegType() == REGT_INT ?
				new FxConstant(-val.Int, ScriptPosition) :
				new FxConstant(-val.Float, ScriptPosition);
			delete this;
			return e;
		}
		ValueType = Operand->ValueType;
		return this;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
}